

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O2

int __thiscall chrono::utils::Generator::selectIngredient(Generator *this)

{
  pointer psVar1;
  uint uVar2;
  default_random_engine *__urng;
  ulong uVar3;
  ulong uVar4;
  result_type rVar5;
  
  __urng = rengine();
  rVar5 = std::uniform_real_distribution<double>::operator()(&this->m_mixDist,__urng);
  psVar1 = (this->m_mixture).
           super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (ulong)((long)(this->m_mixture).
                        super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1) >> 4;
  uVar4 = uVar3 & 0xffffffff;
  do {
    uVar4 = uVar4 - 1;
    if ((int)uVar3 < 1) {
      return 0;
    }
    uVar2 = (int)uVar3 - 1;
    uVar3 = (ulong)uVar2;
  } while (rVar5 <= (psVar1[uVar4 & 0xffffffff].
                     super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->m_cumRatio);
  return uVar2;
}

Assistant:

int Generator::selectIngredient() {
    double val = m_mixDist(rengine());

    for (int i = (int)m_mixture.size() - 1; i >= 0; i--) {
        if (val > m_mixture[i]->m_cumRatio)
            return i;
    }

    return 0;
}